

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::DoubleNearPredFormat
          (internal *this,char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,
          double abs_error)

{
  AssertionResult *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar2;
  AssertionResult local_60;
  double local_50;
  double val1_local;
  double val2_local;
  double abs_error_local;
  double diff;
  char *expr1_local;
  char *expr2_local;
  char *abs_error_expr_local;
  
  abs_error_local = ABS(val1 - val2);
  if (abs_error_local <= abs_error) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_60.success_ = false;
    local_60.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_50 = val1;
    val1_local = val2;
    val2_local = abs_error;
    diff = (double)expr1;
    expr1_local = expr2;
    expr2_local = abs_error_expr;
    pAVar1 = AssertionResult::operator<<(&local_60,(char (*) [24])"The difference between ");
    pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&diff);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [6])" and ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr1_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" is ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&abs_error_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [17])", which exceeds ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [9])", where\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&diff);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_50);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])",\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr1_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&val1_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [7])", and\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&val2_local);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x13f3a8);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_60.message_);
    expr2 = (char *)extraout_RDX;
  }
  AVar2.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1,
                                     const char* expr2,
                                     const char* abs_error_expr,
                                     double val1,
                                     double val2,
                                     double abs_error) {
  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // TODO(wan): do not print the value of an expression if it's
  // already a literal.
  return AssertionFailure()
      << "The difference between " << expr1 << " and " << expr2
      << " is " << diff << ", which exceeds " << abs_error_expr << ", where\n"
      << expr1 << " evaluates to " << val1 << ",\n"
      << expr2 << " evaluates to " << val2 << ", and\n"
      << abs_error_expr << " evaluates to " << abs_error << ".";
}